

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O2

Ver_Stream_t * Ver_StreamAlloc(char *pFileName)

{
  FILE *__stream;
  Ver_Stream_t *pVVar1;
  size_t sVar2;
  char *__ptr;
  size_t __size;
  char *pcVar3;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pVVar1 = (Ver_Stream_t *)0x0;
    printf("Ver_StreamAlloc(): Cannot open input file \"%s\".\n",pFileName);
  }
  else {
    pVVar1 = (Ver_Stream_t *)calloc(1,0x10060);
    pVVar1->pFileName = pFileName;
    pVVar1->pFile = (FILE *)__stream;
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    pVVar1->nFileSize = sVar2;
    rewind(__stream);
    __ptr = (char *)malloc(0x100001);
    pVVar1->pBuffer = __ptr;
    pVVar1->nBufferSize = 0x100000;
    pVVar1->pBufferCur = __ptr;
    __size = (size_t)(int)sVar2;
    if (0xfffff < (long)sVar2) {
      __size = 0x100000;
    }
    fread(__ptr,__size,1,__stream);
    pVVar1->nFileRead = __size;
    pVVar1->pBufferEnd = __ptr + __size;
    pcVar3 = __ptr + 0xf0000;
    if (__size == sVar2) {
      pcVar3 = __ptr + __size;
    }
    pVVar1->pBufferStop = pcVar3;
    pVVar1->nLineCounter = 1;
  }
  return pVVar1;
}

Assistant:

Ver_Stream_t * Ver_StreamAlloc( char * pFileName )
{
    Ver_Stream_t * p;
    FILE * pFile;
    int nCharsToRead;
    int RetValue;
    // check if the file can be opened
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Ver_StreamAlloc(): Cannot open input file \"%s\".\n", pFileName );
        return NULL;
    }
    // start the file reader    
    p = ABC_ALLOC( Ver_Stream_t, 1 );
    memset( p, 0, sizeof(Ver_Stream_t) );
    p->pFileName   = pFileName;
    p->pFile       = pFile;
    // get the file size, in bytes
    fseek( pFile, 0, SEEK_END );  
    p->nFileSize = ftell( pFile );  
    rewind( pFile ); 
    // allocate the buffer
    p->pBuffer = ABC_ALLOC( char, VER_BUFFER_SIZE+1 );
    p->nBufferSize = VER_BUFFER_SIZE;
    p->pBufferCur  = p->pBuffer;
    // determine how many chars to read
    nCharsToRead = VER_MINIMUM(p->nFileSize, VER_BUFFER_SIZE);
    // load the first part into the buffer
    RetValue = fread( p->pBuffer, nCharsToRead, 1, p->pFile );
    p->nFileRead = nCharsToRead;
    // set the ponters to the end and the stopping point
    p->pBufferEnd  = p->pBuffer + nCharsToRead;
    p->pBufferStop = (p->nFileRead == p->nFileSize)? p->pBufferEnd : p->pBuffer + VER_BUFFER_SIZE - VER_OFFSET_SIZE;
    // start the arrays
    p->nLineCounter = 1; // 1-based line counting
    return p;
}